

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  uint8_t *puVar1;
  size_t rec_start;
  uint8_t *puVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  
  rec_start = sendbuf->off;
  iVar5 = ptls_buffer_reserve(sendbuf,3);
  if (iVar5 == 0) {
    puVar2 = sendbuf->base;
    sVar8 = sendbuf->off;
    puVar1 = puVar2 + sVar8;
    puVar1[0] = '\x15';
    puVar1[1] = '\x03';
    puVar2[sVar8 + 2] = '\x03';
    sendbuf->off = sendbuf->off + 3;
    iVar5 = 0;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = ptls_buffer_reserve(sendbuf,2);
  if (iVar5 == 0) {
    puVar1 = sendbuf->base;
    sVar8 = sendbuf->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar5 = 0;
  }
  if (iVar5 == 0) {
    sVar8 = sendbuf->off;
    iVar5 = ptls_buffer_reserve(sendbuf,2);
    if (iVar5 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      puVar1[sVar3] = level;
      puVar1[sVar3 + 1] = description;
      sendbuf->off = sendbuf->off + 2;
      iVar5 = 0;
    }
    if (iVar5 == 0) {
      uVar7 = sendbuf->off - sVar8;
      lVar6 = 8;
      do {
        sendbuf->base[sVar8 - 2] = (uint8_t)(uVar7 >> ((byte)lVar6 & 0x3f));
        lVar6 = lVar6 + -8;
        sVar8 = sVar8 + 1;
      } while (lVar6 != -8);
      bVar4 = true;
      goto LAB_00111274;
    }
  }
  bVar4 = false;
LAB_00111274:
  if (((bVar4) && ((tls->traffic_protection).enc.aead != (ptls_aead_context_t *)0x0)) &&
     (PTLS_STATE_CLIENT_EXPECT_FINISHED < tls->state)) {
    iVar5 = buffer_encrypt_record(sendbuf,rec_start,&(tls->traffic_protection).enc);
    return iVar5;
  }
  return iVar5;
}

Assistant:

int ptls_send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    /* encrypt the alert if we have the encryption keys, unless when it is the early data key */
    if (tls->traffic_protection.enc.aead != NULL && !(tls->state <= PTLS_STATE_CLIENT_EXPECT_FINISHED)) {
        if ((ret = buffer_encrypt_record(sendbuf, rec_start, &tls->traffic_protection.enc)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}